

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::directory_entry::refresh(directory_entry *this)

{
  filesystem_error *this_00;
  error_code ec_00;
  error_code ec;
  error_code local_48;
  string local_38;
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  refresh(this,&local_48);
  if ((local_48._M_value != 0) &&
     (((this->_status)._type == none || ((this->_symlink_status)._type != symlink)))) {
    this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
    detail::systemErrorText<int>(&local_38,local_48._M_value);
    ec_00._4_4_ = 0;
    ec_00._M_value = local_48._M_value;
    ec_00._M_cat = local_48._M_cat;
    filesystem_error::filesystem_error(this_00,&local_38,&this->_path,ec_00);
    __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
  }
  return;
}

Assistant:

GHC_INLINE void directory_entry::refresh()
{
    std::error_code ec;
    refresh(ec);
    if (ec && (_status.type() == file_type::none || _symlink_status.type() != file_type::symlink)) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _path, ec);
    }
}